

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementCableANCF::ComputeKRMmatricesGlobal
          (ChElementCableANCF *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  double local_88;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>
  local_80;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>_>
  local_58;
  
  local_88 = Mfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value == 0xc) &&
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 0xc)) {
    if ((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
        [0x1e])(Kfactor,this);
      Eigen::operator*(&local_80,&local_88,(StorageBaseType *)&this->m_MassMatrix);
      local_58.m_rhs.m_lhs.m_functor.m_other = local_80.m_lhs.m_functor.m_other;
      local_58.m_rhs.m_rhs = local_80.m_rhs;
      local_58.m_lhs = &this->m_JacobianMatrix;
      Eigen::internal::
      call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,12,12,1,12,12>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,12,12,1,12,12>const>const,Eigen::Matrix<double,12,12,1,12,12>const>const>>
                (H,&local_58);
      return;
    }
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementCableANCF.cpp"
                  ,0x19f,
                  "virtual void chrono::fea::ChElementCableANCF::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  __assert_fail("(H.rows() == 12) && (H.cols() == 12)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementCableANCF.cpp"
                ,0x19e,
                "virtual void chrono::fea::ChElementCableANCF::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementCableANCF::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 12) && (H.cols() == 12));
    assert(section);

    // Calculate the linear combination Kfactor*[K] + Rfactor*[R]
    ComputeInternalJacobians(Kfactor, Rfactor);

    // Load Jac + Mfactor*[M] into H
    H = m_JacobianMatrix + Mfactor * m_MassMatrix;
}